

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    if (*(long *)(*(long *)((long)pointer + 0x1a8) + 0x20) == (long)pointer + 400) {
      *(undefined8 *)(*(long *)((long)pointer + 0x1a8) + 0x20) = 0;
    }
    Canceler::~Canceler((Canceler *)((long)pointer + 0x1c8));
    NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)((long)pointer + 0x18));
  }
  operator_delete(pointer,0x1d0);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }